

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O2

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::GenerateSequenceInternal
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this)

{
  CornerTable *pCVar1;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  CornerTable *pCVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  const_reference pvVar6;
  uint uVar7;
  CornerIndex corner_id;
  int iVar8;
  ulong __n;
  bool bVar9;
  
  pCVar1 = (this->traverser_).
           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           .corner_table_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::reserve((this->super_PointsSequencer).out_point_ids_,
            (long)(int)((ulong)((long)(pCVar1->vertex_to_attribute_entry_id_map_).
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar1->vertex_to_attribute_entry_id_map_).
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  if (this->corner_order_ ==
      (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       *)0x0) {
    pCVar2 = ((this->traverser_).
              super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             .corner_table_)->corner_table_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(pCVar2->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar2->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
    iVar8 = SUB164(auVar3 / ZEXT816(3),0);
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    iVar8 = iVar8 + 1;
    corner_id.value_ = 0;
    do {
      iVar8 = iVar8 + -1;
      bVar9 = iVar8 == 0;
      if (bVar9) {
        return bVar9;
      }
      bVar4 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::TraverseFromCorner(&this->traverser_,corner_id);
      corner_id.value_ = corner_id.value_ + 3;
    } while (bVar4);
  }
  else {
    uVar7 = 0;
    do {
      __n = (ulong)uVar7;
      this_00 = this->corner_order_;
      uVar5 = (long)(this_00->
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2;
      bVar9 = uVar5 <= __n;
      if (uVar5 <= __n) {
        return bVar9;
      }
      pvVar6 = std::
               vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ::at(this_00,__n);
      bVar4 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::TraverseFromCorner(&this->traverser_,(CornerIndex)pvVar6->value_);
      uVar7 = uVar7 + 1;
    } while (bVar4);
  }
  return bVar9;
}

Assistant:

bool GenerateSequenceInternal() override {
    // Preallocate memory for storing point indices. We expect the number of
    // points to be the same as the number of corner table vertices.
    out_point_ids()->reserve(traverser_.corner_table()->num_vertices());

    traverser_.OnTraversalStart();
    if (corner_order_) {
      for (uint32_t i = 0; i < corner_order_->size(); ++i) {
        if (!ProcessCorner(corner_order_->at(i))) {
          return false;
        }
      }
    } else {
      const int32_t num_faces = traverser_.corner_table()->num_faces();
      for (int i = 0; i < num_faces; ++i) {
        if (!ProcessCorner(CornerIndex(3 * i))) {
          return false;
        }
      }
    }
    traverser_.OnTraversalEnd();
    return true;
  }